

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.h
# Opt level: O2

EM * __thiscall EM::operator=(EM *this,EM *anotherEM)

{
  ulong uVar1;
  
  this->nextid = anotherEM->nextid;
  uVar1._0_4_ = anotherEM->currbuffsize;
  uVar1._4_4_ = anotherEM->firsteltindex;
  this->currbuffsize = (undefined4)uVar1;
  this->firsteltindex = uVar1._4_4_;
  for (uVar1 = uVar1 & 0xffffffff; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
    this->buff[uVar1] = anotherEM->buff[uVar1];
  }
  return this;
}

Assistant:

EM& operator = (EM &anotherEM) {
		this->nextid = anotherEM.getNextId();
		this->currbuffsize = anotherEM.getCurrBuffSize();
		this->firsteltindex = anotherEM.getFirstEltIndex();
		int i = this->currbuffsize;
		while (i > 0) {
			this->buff[i] = anotherEM.buff[i];
			i--;
		}
		return *this;
	}